

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

GraphCycles * __thiscall xla::GraphCycles::DebugString_abi_cxx11_(GraphCycles *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  vector<int,_std::allocator<int>_> *this_00;
  reference piVar4;
  long *in_RSI;
  __cxx11 local_170 [32];
  __cxx11 local_150 [32];
  string local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [36];
  int local_ac;
  const_iterator cStack_a8;
  int32_t succ;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int32_t index;
  int64_t end;
  int64_t i;
  allocator<int> local_63;
  key_equal local_62;
  hasher local_61;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  undefined1 local_50 [8];
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> free_nodes_set;
  GraphCycles *this_local;
  string *result;
  
  local_58._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)(*in_RSI + 0x30));
  local_60._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)(*in_RSI + 0x30));
  std::allocator<int>::allocator(&local_63);
  std::unordered_set<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>::
  unordered_set<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((unordered_set<int,std::hash<int>,std::equal_to<int>,std::allocator<int>> *)local_50,
             local_58,local_60,0,&local_61,&local_62,&local_63);
  std::allocator<int>::~allocator(&local_63);
  i._3_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"digraph {\n",(allocator *)((long)&i + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 2));
  end = 0;
  sVar2 = std::
          vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
          ::size((vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                  *)*in_RSI);
  for (; end < (long)sVar2; end = end + 1) {
    bVar1 = anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&contains,
                       (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                        *)local_50,(int32_t)end);
    if (bVar1) {
      pvVar3 = std::
               vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
               ::operator[]((vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                             *)(*in_RSI + 0x18),end);
      this_00 = OrderedSet<int>::GetSequence(&pvVar3->out);
      __end2 = std::vector<int,_std::allocator<int>_>::begin(this_00);
      cStack_a8 = std::vector<int,_std::allocator<int>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff58), bVar1) {
        piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&__end2);
        local_ac = *piVar4;
        std::__cxx11::to_string(local_150,end);
        std::operator+((char *)local_130,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"  \"");
        std::operator+(local_110,(char *)local_130);
        std::__cxx11::to_string(local_170,local_ac);
        std::operator+(local_f0,local_110);
        std::operator+(local_d0,(char *)local_f0);
        std::__cxx11::string::operator+=((string *)this,(string *)local_d0);
        std::__cxx11::string::~string((string *)local_d0);
        std::__cxx11::string::~string((string *)local_f0);
        std::__cxx11::string::~string((string *)local_170);
        std::__cxx11::string::~string((string *)local_110);
        std::__cxx11::string::~string(local_130);
        std::__cxx11::string::~string((string *)local_150);
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&__end2);
      }
    }
  }
  std::__cxx11::string::operator+=((string *)this,"}\n");
  i._3_1_ = 1;
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::~unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             local_50);
  return this;
}

Assistant:

std::string GraphCycles::DebugString() const {
  std::unordered_set<int32_t> free_nodes_set(rep_->free_nodes_.begin(),
                                              rep_->free_nodes_.end());

  std::string result = "digraph {\n";
  for (int64_t i = 0, end = rep_->nodes_.size(); i < end; i++) {
    int32_t index = static_cast<int32_t>(i);
    if (!contains(free_nodes_set, index)) {
      continue;
    }

    for (int32_t succ : rep_->node_io_[i].out.GetSequence()) {
      result += "  \"" + std::to_string(i) + "\" -> \"" + std::to_string(succ) + "\"\n";
    }
  }

  result += "}\n";

  return result;
}